

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase * AnalyzeIfElse(ExpressionContext *ctx,SynIfElse *syntax)

{
  ScopeData *pSVar1;
  ExprBase *pEVar2;
  Lexeme *pLVar3;
  TypeBase *pTVar4;
  ExprBase *pEVar5;
  ExprBase *pEVar6;
  ExprBlock *pEVar7;
  SynBlock *syntax_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  SynBase *pSVar8;
  ExprBase *pEVar9;
  int iVar10;
  FunctionData *onwerFunction;
  SynBlock *syntax_01;
  ExprBlock *pEVar11;
  SynBase *pSVar12;
  IntrusiveList<ExprBase> expressions;
  IntrusiveList<ExprBase> local_48;
  undefined4 extraout_var_02;
  
  pSVar8 = syntax->condition;
  if ((pSVar8 == (SynBase *)0x0) || (pSVar12 = pSVar8, pSVar8->typeID != 0x34)) {
    pSVar12 = (SynBase *)0x0;
  }
  if (pSVar12 == (SynBase *)0x0) {
    pEVar5 = AnalyzeExpression(ctx,pSVar8);
  }
  else {
    ExpressionContext::PushScope(ctx,SCOPE_EXPLICIT);
    pLVar3 = pSVar12[1].begin;
    if (pLVar3 == (Lexeme *)0x0) {
LAB_00184354:
      __assert_fail("definitions->definitions.size() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x2b7f,"ExprBase *AnalyzeIfElse(ExpressionContext &, SynIfElse *)");
    }
    iVar10 = 1;
    do {
      pLVar3 = *(Lexeme **)&pLVar3[1].length;
      iVar10 = iVar10 + -1;
    } while (pLVar3 != (Lexeme *)0x0);
    if (iVar10 != 0) goto LAB_00184354;
    pTVar4 = AnalyzeType(ctx,*(SynBase **)&pSVar12[1].typeID,true,(bool *)0x0);
    pEVar5 = AnalyzeVariableDefinition(ctx,(SynVariableDefinition *)pSVar12[1].begin,0,pTVar4);
    if ((pEVar5 == (ExprBase *)0x0) || (pEVar6 = pEVar5, pEVar5->typeID != 0x1e)) {
      pEVar6 = (ExprBase *)0x0;
    }
    if (pEVar6 != (ExprBase *)0x0) {
      pEVar6 = CreateVariableAccess
                         (ctx,&syntax->super_SynBase,(VariableData *)pEVar6[1]._vptr_ExprBase[1],
                          false);
      pEVar5 = CreateSequence(ctx,&syntax->super_SynBase,pEVar5,pEVar6);
    }
  }
  if ((syntax->super_SynBase).field_0x3a != '\x01') goto LAB_001841e4;
  if ((pEVar5->type != (TypeBase *)0x0) && (pEVar5->type->typeID == 0)) {
    iVar10 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
    pEVar5 = (ExprBase *)CONCAT44(extraout_var,iVar10);
    pTVar4 = ctx->typeVoid;
    pEVar5->typeID = 2;
    pEVar5->source = &syntax->super_SynBase;
    pEVar5->type = pTVar4;
    pEVar5->next = (ExprBase *)0x0;
    pEVar5->listed = false;
    pEVar5->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248688;
    return pEVar5;
  }
  pEVar5 = CreateConditionCast(ctx,pEVar5->source,pEVar5);
  pEVar6 = CreateCast(ctx,&syntax->super_SynBase,pEVar5,ctx->typeBool,false);
  pEVar7 = (ExprBlock *)
           anon_unknown.dwarf_c6b42::EvaluateExpression(ctx,&syntax->super_SynBase,pEVar6);
  if ((pEVar7 == (ExprBlock *)0x0) || (pEVar11 = pEVar7, (pEVar7->super_ExprBase).typeID != 3)) {
    pEVar11 = (ExprBlock *)0x0;
  }
  if (pEVar11 != (ExprBlock *)0x0) {
    if ((pEVar11->super_ExprBase).field_0x29 == '\x01') {
      syntax_01 = (SynBlock *)syntax->trueBlock;
      if ((syntax_01 == (SynBlock *)0x0) ||
         (syntax_00 = syntax_01, (syntax_01->super_SynBase).typeID != 0x26)) {
        syntax_00 = (SynBlock *)0x0;
      }
      if (syntax_00 == (SynBlock *)0x0) {
LAB_0018417f:
        pEVar7 = (ExprBlock *)AnalyzeStatement(ctx,&syntax_01->super_SynBase);
      }
      else {
LAB_00184130:
        pEVar7 = AnalyzeBlock(ctx,syntax_00,false);
      }
    }
    else {
      syntax_00 = (SynBlock *)syntax->falseBlock;
      if (syntax_00 != (SynBlock *)0x0) {
        syntax_01 = syntax_00;
        if ((syntax_00->super_SynBase).typeID != 0x26) goto LAB_0018417f;
        goto LAB_00184130;
      }
      iVar10 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
      pEVar7 = (ExprBlock *)CONCAT44(extraout_var_00,iVar10);
      pTVar4 = ctx->typeVoid;
      (pEVar7->super_ExprBase).typeID = 2;
      (pEVar7->super_ExprBase).source = &syntax->super_SynBase;
      (pEVar7->super_ExprBase).type = pTVar4;
      (pEVar7->super_ExprBase).next = (ExprBase *)0x0;
      (pEVar7->super_ExprBase).listed = false;
      (pEVar7->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248688;
    }
  }
  if (pEVar11 != (ExprBlock *)0x0) {
    return &pEVar7->super_ExprBase;
  }
  anon_unknown.dwarf_c6b42::Report
            (ctx,&syntax->super_SynBase,"ERROR: couldn\'t evaluate condition at compilation time");
LAB_001841e4:
  pEVar5 = CreateConditionCast(ctx,pEVar5->source,pEVar5);
  pEVar6 = AnalyzeStatement(ctx,syntax->trueBlock);
  if (pSVar12 != (SynBase *)0x0) {
    local_48.head = (ExprBase *)0x0;
    local_48.tail = (ExprBase *)0x0;
    IntrusiveList<ExprBase>::push_back(&local_48,pEVar6);
    iVar10 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    pEVar2 = local_48.tail;
    pEVar9 = local_48.head;
    pEVar6 = (ExprBase *)CONCAT44(extraout_var_01,iVar10);
    pTVar4 = ctx->typeVoid;
    pSVar8 = &ExpressionContext::MakeInternal(ctx,&syntax->super_SynBase)->super_SynBase;
    for (pSVar1 = ctx->scope; (pSVar1 != (ScopeData *)0x0 && (pSVar1->ownerType == (TypeBase *)0x0))
        ; pSVar1 = pSVar1->scope) {
      onwerFunction = pSVar1->ownerFunction;
      if (onwerFunction != (FunctionData *)0x0) goto LAB_00184287;
    }
    onwerFunction = (FunctionData *)0x0;
LAB_00184287:
    pSVar8 = (SynBase *)CreateBlockUpvalueClose(ctx,pSVar8,onwerFunction,ctx->scope);
    pEVar6->typeID = 0x36;
    pEVar6->source = &syntax->super_SynBase;
    pEVar6->type = pTVar4;
    pEVar6->next = (ExprBase *)0x0;
    pEVar6->listed = false;
    pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002490a0;
    pEVar6[1]._vptr_ExprBase = (_func_int **)pEVar9;
    *(ExprBase **)&pEVar6[1].typeID = pEVar2;
    pEVar6[1].source = pSVar8;
    ExpressionContext::PopScope(ctx,SCOPE_EXPLICIT,true);
  }
  if (syntax->falseBlock == (SynBase *)0x0) {
    pSVar8 = (SynBase *)0x0;
  }
  else {
    pSVar8 = (SynBase *)AnalyzeStatement(ctx,syntax->falseBlock);
  }
  iVar10 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
  pEVar9 = (ExprBase *)CONCAT44(extraout_var_02,iVar10);
  pTVar4 = ctx->typeVoid;
  pEVar9->typeID = 0x2f;
  pEVar9->source = &syntax->super_SynBase;
  pEVar9->type = pTVar4;
  pEVar9->next = (ExprBase *)0x0;
  pEVar9->listed = false;
  pEVar9->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00249298;
  pEVar9[1]._vptr_ExprBase = (_func_int **)pEVar5;
  *(ExprBase **)&pEVar9[1].typeID = pEVar6;
  pEVar9[1].source = pSVar8;
  return pEVar9;
}

Assistant:

ExprBase* AnalyzeIfElse(ExpressionContext &ctx, SynIfElse *syntax)
{
	SynVariableDefinitions *definitions = getType<SynVariableDefinitions>(syntax->condition);

	ExprBase *condition = NULL;

	if(definitions)
	{
		ctx.PushScope(SCOPE_EXPLICIT);

		assert(definitions->definitions.size() == 1);

		TypeBase *type = AnalyzeType(ctx, definitions->type);

		ExprBase *definition = AnalyzeVariableDefinition(ctx, definitions->definitions.head, 0, type);

		if(ExprVariableDefinition *variableDefinition = getType<ExprVariableDefinition>(definition))
			condition = CreateSequence(ctx, syntax, definition, CreateVariableAccess(ctx, syntax, variableDefinition->variable->variable, false));
		else
			condition = definition;
	}
	else
	{
		condition = AnalyzeExpression(ctx, syntax->condition);
	}

	if(syntax->staticIf)
	{
		if(isType<TypeError>(condition->type))
			return new (ctx.get<ExprVoid>()) ExprVoid(syntax, ctx.typeVoid);

		condition = CreateConditionCast(ctx, condition->source, condition);

		if(ExprBoolLiteral *number = getType<ExprBoolLiteral>(EvaluateExpression(ctx, syntax, CreateCast(ctx, syntax, condition, ctx.typeBool, false))))
		{
			if(number->value)
			{
				if(SynBlock *node = getType<SynBlock>(syntax->trueBlock))
					return AnalyzeBlock(ctx, node, false);
				else
					return AnalyzeStatement(ctx, syntax->trueBlock);
			}
			else if(syntax->falseBlock)
			{
				if(SynBlock *node = getType<SynBlock>(syntax->falseBlock))
					return AnalyzeBlock(ctx, node, false);
				else
					return AnalyzeStatement(ctx, syntax->falseBlock);
			}

			return new (ctx.get<ExprVoid>()) ExprVoid(syntax, ctx.typeVoid);
		}

		Report(ctx, syntax, "ERROR: couldn't evaluate condition at compilation time");
	}

	condition = CreateConditionCast(ctx, condition->source, condition);

	ExprBase *trueBlock = AnalyzeStatement(ctx, syntax->trueBlock);

	if(definitions)
	{
		IntrusiveList<ExprBase> expressions;

		expressions.push_back(trueBlock);

		trueBlock = new (ctx.get<ExprBlock>()) ExprBlock(syntax, ctx.typeVoid, expressions, CreateBlockUpvalueClose(ctx, ctx.MakeInternal(syntax), ctx.GetCurrentFunction(ctx.scope), ctx.scope));

		ctx.PopScope(SCOPE_EXPLICIT);
	}

	ExprBase *falseBlock = syntax->falseBlock ? AnalyzeStatement(ctx, syntax->falseBlock) : NULL;

	return new (ctx.get<ExprIfElse>()) ExprIfElse(syntax, ctx.typeVoid, condition, trueBlock, falseBlock);
}